

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__parse_png_file(stbi__png *z,int scan,int req_comp)

{
  stbi__context *psVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  byte bVar5;
  stbi_uc sVar6;
  int iVar7;
  stbi__uint32 sVar8;
  stbi__pngchunk a;
  stbi_uc *psVar9;
  int in_EDX;
  int in_ESI;
  stbi__png *in_RDI;
  stbi__uint32 bpl;
  stbi__uint32 raw_len;
  stbi_uc *p;
  stbi__uint32 idata_limit_old;
  int filter;
  int comp;
  stbi__pngchunk c;
  stbi__context *s;
  int is_iphone;
  int color;
  int interlace;
  int k;
  int first;
  stbi__uint32 pal_len;
  stbi__uint32 i;
  stbi__uint32 idata_limit;
  stbi__uint32 ioff;
  stbi__uint16 tc16 [3];
  stbi_uc tc [3];
  stbi_uc has_trans;
  stbi_uc pal_img_n;
  stbi_uc palette [1024];
  int in_stack_00000b84;
  int *in_stack_00000b88;
  int in_stack_00000b90;
  int in_stack_00000b94;
  char *in_stack_00000b98;
  undefined4 in_stack_fffffffffffffb78;
  int in_stack_fffffffffffffb7c;
  uint in_stack_fffffffffffffb80;
  stbi__uint32 sVar10;
  undefined4 in_stack_fffffffffffffb88;
  undefined4 in_stack_fffffffffffffb8c;
  int in_stack_fffffffffffffb98;
  uint in_stack_fffffffffffffb9c;
  uint uVar11;
  uint in_stack_fffffffffffffba0;
  uint in_stack_fffffffffffffba4;
  uint uVar12;
  int local_43c;
  uint local_434;
  uint local_430;
  uint local_42c;
  int local_428;
  stbi__uint16 local_424 [3];
  stbi_uc local_41d [4];
  byte local_419;
  stbi_uc local_418 [72];
  int in_stack_fffffffffffffc30;
  int in_stack_fffffffffffffc34;
  int in_stack_fffffffffffffc38;
  stbi__uint32 in_stack_fffffffffffffc3c;
  stbi_uc *in_stack_fffffffffffffc40;
  stbi__png *in_stack_fffffffffffffc48;
  int in_stack_fffffffffffffc60;
  int local_4;
  
  local_419 = 0;
  local_41d[3] = '\0';
  memset(local_41d,0,3);
  local_428 = 0;
  local_42c = 0;
  local_434 = 0;
  bVar2 = true;
  bVar3 = false;
  psVar1 = in_RDI->s;
  in_RDI->expanded = (stbi_uc *)0x0;
  in_RDI->idata = (stbi_uc *)0x0;
  in_RDI->out = (stbi_uc *)0x0;
  iVar7 = stbi__check_png_header
                    ((stbi__context *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78))
  ;
  if (iVar7 == 0) {
    local_4 = 0;
  }
  else {
    if (in_ESI != 1) {
      do {
        uVar11 = local_42c;
        a = stbi__get_chunk_header
                      ((stbi__context *)
                       CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
        sVar10 = a.type;
        if (sVar10 == 0x43674249) {
          bVar3 = true;
          stbi__skip((stbi__context *)CONCAT44(0x43674249,in_stack_fffffffffffffb80),
                     in_stack_fffffffffffffb7c);
        }
        else {
          uVar12 = a.length;
          if (sVar10 == 0x49444154) {
            if (bVar2) {
              iVar7 = stbi__err("first not IHDR");
              return iVar7;
            }
            if ((local_419 != 0) && (local_434 == 0)) {
              iVar7 = stbi__err("no PLTE");
              return iVar7;
            }
            if (in_ESI == 2) {
              psVar1->img_n = (uint)local_419;
              return 1;
            }
            if ((int)(local_428 + uVar12) < local_428) {
              return 0;
            }
            if (local_42c < local_428 + uVar12) {
              if ((local_42c == 0) &&
                 (local_42c = uVar12, in_stack_fffffffffffffb80 = uVar12, uVar12 < 0x1001)) {
                local_42c = 0x1000;
                in_stack_fffffffffffffb80 = 0x1000;
              }
              for (; local_42c < local_428 + uVar12; local_42c = local_42c << 1) {
              }
              psVar9 = (stbi_uc *)realloc(in_RDI->idata,(ulong)local_42c);
              if (psVar9 == (stbi_uc *)0x0) {
                iVar7 = stbi__err("outofmem");
                return iVar7;
              }
              in_RDI->idata = psVar9;
              in_stack_fffffffffffffb9c = uVar11;
            }
            sVar8 = a.length;
            iVar7 = stbi__getn((stbi__context *)
                               CONCAT44(in_stack_fffffffffffffb8c,in_stack_fffffffffffffb88),
                               (stbi_uc *)CONCAT44(sVar10,in_stack_fffffffffffffb80),
                               in_stack_fffffffffffffb7c);
            if (iVar7 == 0) {
              iVar7 = stbi__err("outofdata");
              return iVar7;
            }
            local_428 = sVar8 + local_428;
          }
          else {
            if (sVar10 == 0x49454e44) {
              if (bVar2) {
                iVar7 = stbi__err("first not IHDR");
                return iVar7;
              }
              if (in_ESI != 0) {
                return 1;
              }
              if (in_RDI->idata == (stbi_uc *)0x0) {
                iVar7 = stbi__err("no IDAT");
                return iVar7;
              }
              psVar9 = (stbi_uc *)
                       stbi_zlib_decode_malloc_guesssize_headerflag
                                 (in_stack_00000b98,in_stack_00000b94,in_stack_00000b90,
                                  in_stack_00000b88,in_stack_00000b84);
              in_RDI->expanded = psVar9;
              if (in_RDI->expanded != (stbi_uc *)0x0) {
                free(in_RDI->idata);
                in_RDI->idata = (stbi_uc *)0x0;
                if ((((in_EDX == psVar1->img_n + 1) && (in_EDX != 3)) && (local_419 == 0)) ||
                   (local_41d[3] != '\0')) {
                  psVar1->img_out_n = psVar1->img_n + 1;
                }
                else {
                  psVar1->img_out_n = psVar1->img_n;
                }
                iVar7 = stbi__create_png_image
                                  (in_stack_fffffffffffffc48,in_stack_fffffffffffffc40,
                                   in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38,
                                   in_stack_fffffffffffffc34,in_stack_fffffffffffffc30,
                                   in_stack_fffffffffffffc60);
                if (iVar7 == 0) {
                  return 0;
                }
                if (local_41d[3] != '\0') {
                  if (in_RDI->depth == 0x10) {
                    iVar7 = stbi__compute_transparency16(in_RDI,local_424,psVar1->img_out_n);
                    if (iVar7 == 0) {
                      return 0;
                    }
                  }
                  else {
                    iVar7 = stbi__compute_transparency(in_RDI,local_41d,psVar1->img_out_n);
                    if (iVar7 == 0) {
                      return 0;
                    }
                  }
                }
                if (((bVar3) && (stbi__de_iphone_flag != 0)) && (2 < psVar1->img_out_n)) {
                  stbi__de_iphone(in_RDI);
                }
                if (local_419 == 0) {
                  if (local_41d[3] != '\0') {
                    psVar1->img_n = psVar1->img_n + 1;
                  }
                }
                else {
                  psVar1->img_n = (uint)local_419;
                  psVar1->img_out_n = (uint)local_419;
                  if (2 < in_EDX) {
                    psVar1->img_out_n = in_EDX;
                  }
                  iVar7 = stbi__expand_png_palette
                                    ((stbi__png *)a,
                                     (stbi_uc *)
                                     CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                                     in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98);
                  if (iVar7 == 0) {
                    return 0;
                  }
                }
                free(in_RDI->expanded);
                in_RDI->expanded = (stbi_uc *)0x0;
                return 1;
              }
              return 0;
            }
            if (sVar10 == 0x49484452) {
              if (!bVar2) {
                iVar7 = stbi__err("multiple IHDR");
                return iVar7;
              }
              bVar2 = false;
              if (uVar12 != 0xd) {
                iVar7 = stbi__err("bad IHDR len");
                return iVar7;
              }
              sVar8 = stbi__get32be((stbi__context *)CONCAT44(0x49484452,in_stack_fffffffffffffb80))
              ;
              psVar1->img_x = sVar8;
              if (0x1000000 < psVar1->img_x) {
                iVar7 = stbi__err("too large");
                return iVar7;
              }
              sVar8 = stbi__get32be((stbi__context *)CONCAT44(sVar10,in_stack_fffffffffffffb80));
              psVar1->img_y = sVar8;
              if (0x1000000 < psVar1->img_y) {
                iVar7 = stbi__err("too large");
                return iVar7;
              }
              bVar4 = stbi__get8((stbi__context *)
                                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
              in_RDI->depth = (uint)bVar4;
              if (((in_RDI->depth != 1) && (in_RDI->depth != 2)) &&
                 ((in_RDI->depth != 4 && ((in_RDI->depth != 8 && (in_RDI->depth != 0x10)))))) {
                iVar7 = stbi__err("1/2/4/8/16-bit only");
                return iVar7;
              }
              bVar4 = stbi__get8((stbi__context *)
                                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
              if (6 < bVar4) {
                iVar7 = stbi__err("bad ctype");
                return iVar7;
              }
              if ((bVar4 == 3) && (in_RDI->depth == 0x10)) {
                iVar7 = stbi__err("bad ctype");
                return iVar7;
              }
              if (bVar4 == 3) {
                local_419 = 3;
              }
              else if ((bVar4 & 1) != 0) {
                iVar7 = stbi__err("bad ctype");
                return iVar7;
              }
              bVar5 = stbi__get8((stbi__context *)
                                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
              in_stack_fffffffffffffba4 = (uint)bVar5;
              if (in_stack_fffffffffffffba4 != 0) {
                iVar7 = stbi__err("bad comp method");
                return iVar7;
              }
              bVar5 = stbi__get8((stbi__context *)
                                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
              in_stack_fffffffffffffba0 = (uint)bVar5;
              if (in_stack_fffffffffffffba0 != 0) {
                iVar7 = stbi__err("bad filter method");
                return iVar7;
              }
              bVar5 = stbi__get8((stbi__context *)
                                 CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
              if (1 < bVar5) {
                iVar7 = stbi__err("bad interlace method");
                return iVar7;
              }
              if ((psVar1->img_x == 0) || (psVar1->img_y == 0)) {
                iVar7 = stbi__err("0-pixel image");
                return iVar7;
              }
              if (local_419 == 0) {
                iVar7 = 1;
                if ((bVar4 & 2) != 0) {
                  iVar7 = 3;
                }
                psVar1->img_n = iVar7 + (uint)((bVar4 & 4) != 0);
                if ((uint)((0x40000000 / (ulong)psVar1->img_x) / (ulong)(uint)psVar1->img_n) <
                    psVar1->img_y) {
                  iVar7 = stbi__err("too large");
                  return iVar7;
                }
                if (in_ESI == 2) {
                  return 1;
                }
              }
              else {
                psVar1->img_n = 1;
                if ((uint)(0x40000000 / (ulong)psVar1->img_x >> 2) < psVar1->img_y) {
                  iVar7 = stbi__err("too large");
                  return iVar7;
                }
              }
            }
            else if (sVar10 == 0x504c5445) {
              if (bVar2) {
                iVar7 = stbi__err("first not IHDR");
                return iVar7;
              }
              if (0x300 < uVar12) {
                iVar7 = stbi__err("invalid PLTE");
                return iVar7;
              }
              local_434 = uVar12 / 3;
              if (local_434 * 3 != uVar12) {
                iVar7 = stbi__err("invalid PLTE");
                return iVar7;
              }
              for (local_430 = 0; local_430 < local_434; local_430 = local_430 + 1) {
                sVar6 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
                local_41d[(ulong)(local_430 << 2) + 5] = sVar6;
                sVar6 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
                local_41d[(ulong)(local_430 * 4 + 1) + 5] = sVar6;
                sVar6 = stbi__get8((stbi__context *)
                                   CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
                local_41d[(ulong)(local_430 * 4 + 2) + 5] = sVar6;
                local_41d[(ulong)(local_430 * 4 + 3) + 5] = 0xff;
              }
            }
            else if (sVar10 == 0x74524e53) {
              if (bVar2) {
                iVar7 = stbi__err("first not IHDR");
                return iVar7;
              }
              if (in_RDI->idata != (stbi_uc *)0x0) {
                iVar7 = stbi__err("tRNS after IDAT");
                return iVar7;
              }
              if (local_419 == 0) {
                if ((psVar1->img_n & 1U) == 0) {
                  iVar7 = stbi__err("tRNS with alpha");
                  return iVar7;
                }
                if (uVar12 != psVar1->img_n * 2) {
                  iVar7 = stbi__err("bad tRNS len");
                  return iVar7;
                }
                local_41d[3] = '\x01';
                if (in_RDI->depth == 0x10) {
                  for (local_43c = 0; local_43c < psVar1->img_n; local_43c = local_43c + 1) {
                    iVar7 = stbi__get16be((stbi__context *)
                                          CONCAT44(sVar10,in_stack_fffffffffffffb80));
                    local_424[local_43c] = (stbi__uint16)iVar7;
                  }
                }
                else {
                  for (local_43c = 0; local_43c < psVar1->img_n; local_43c = local_43c + 1) {
                    iVar7 = stbi__get16be((stbi__context *)
                                          CONCAT44(sVar10,in_stack_fffffffffffffb80));
                    local_41d[local_43c] = (char)iVar7 * ""[in_RDI->depth];
                  }
                }
              }
              else {
                if (in_ESI == 2) {
                  psVar1->img_n = 4;
                  return 1;
                }
                if (local_434 == 0) {
                  iVar7 = stbi__err("tRNS before PLTE");
                  return iVar7;
                }
                if (local_434 < uVar12) {
                  iVar7 = stbi__err("bad tRNS len");
                  return iVar7;
                }
                local_419 = 4;
                for (local_430 = 0; local_430 < a.length; local_430 = local_430 + 1) {
                  sVar6 = stbi__get8((stbi__context *)
                                     CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
                  local_41d[(ulong)(local_430 * 4 + 3) + 5] = sVar6;
                }
              }
            }
            else {
              if (bVar2) {
                iVar7 = stbi__err("first not IHDR");
                return iVar7;
              }
              if (((ulong)a & 0x2000000000000000) == 0) {
                stbi__parse_png_file::invalid_chunk[0] = a.type._3_1_;
                stbi__parse_png_file::invalid_chunk[1] = a.type._2_1_;
                stbi__parse_png_file::invalid_chunk[2] = a.type._1_1_;
                stbi__parse_png_file::invalid_chunk[3] = (char)a.type;
                iVar7 = stbi__err(stbi__parse_png_file::invalid_chunk);
                return iVar7;
              }
              stbi__skip((stbi__context *)CONCAT44(sVar10,in_stack_fffffffffffffb80),
                         in_stack_fffffffffffffb7c);
            }
          }
        }
        stbi__get32be((stbi__context *)CONCAT44(sVar10,in_stack_fffffffffffffb80));
      } while( true );
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__parse_png_file(stbi__png *z, int scan, int req_comp)
{
   stbi_uc palette[1024], pal_img_n=0;
   stbi_uc has_trans=0, tc[3]={0};
   stbi__uint16 tc16[3];
   stbi__uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k,interlace=0, color=0, is_iphone=0;
   stbi__context *s = z->s;

   z->expanded = NULL;
   z->idata = NULL;
   z->out = NULL;

   if (!stbi__check_png_header(s)) return 0;

   if (scan == STBI__SCAN_type) return 1;

   for (;;) {
      stbi__pngchunk c = stbi__get_chunk_header(s);
      switch (c.type) {
         case STBI__PNG_TYPE('C','g','B','I'):
            is_iphone = 1;
            stbi__skip(s, c.length);
            break;
         case STBI__PNG_TYPE('I','H','D','R'): {
            int comp,filter;
            if (!first) return stbi__err("multiple IHDR","Corrupt PNG");
            first = 0;
            if (c.length != 13) return stbi__err("bad IHDR len","Corrupt PNG");
            s->img_x = stbi__get32be(s); if (s->img_x > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            s->img_y = stbi__get32be(s); if (s->img_y > (1 << 24)) return stbi__err("too large","Very large image (corrupt?)");
            z->depth = stbi__get8(s);  if (z->depth != 1 && z->depth != 2 && z->depth != 4 && z->depth != 8 && z->depth != 16)  return stbi__err("1/2/4/8/16-bit only","PNG not supported: 1/2/4/8/16-bit only");
            color = stbi__get8(s);  if (color > 6)         return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3 && z->depth == 16)                  return stbi__err("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return stbi__err("bad ctype","Corrupt PNG");
            comp  = stbi__get8(s);  if (comp) return stbi__err("bad comp method","Corrupt PNG");
            filter= stbi__get8(s);  if (filter) return stbi__err("bad filter method","Corrupt PNG");
            interlace = stbi__get8(s); if (interlace>1) return stbi__err("bad interlace method","Corrupt PNG");
            if (!s->img_x || !s->img_y) return stbi__err("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");
               if (scan == STBI__SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return stbi__err("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case STBI__PNG_TYPE('P','L','T','E'):  {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (c.length > 256*3) return stbi__err("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return stbi__err("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = stbi__get8(s);
               palette[i*4+1] = stbi__get8(s);
               palette[i*4+2] = stbi__get8(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case STBI__PNG_TYPE('t','R','N','S'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (z->idata) return stbi__err("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == STBI__SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return stbi__err("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return stbi__err("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = stbi__get8(s);
            } else {
               if (!(s->img_n & 1)) return stbi__err("tRNS with alpha","Corrupt PNG");
               if (c.length != (stbi__uint32) s->img_n*2) return stbi__err("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               if (z->depth == 16) {
                  for (k = 0; k < s->img_n; ++k) tc16[k] = (stbi__uint16)stbi__get16be(s); // copy the values as-is
               } else {
                  for (k = 0; k < s->img_n; ++k) tc[k] = (stbi_uc)(stbi__get16be(s) & 255) * stbi__depth_scale_table[z->depth]; // non 8-bit images will be larger
               }
            }
            break;
         }

         case STBI__PNG_TYPE('I','D','A','T'): {
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (pal_img_n && !pal_len) return stbi__err("no PLTE","Corrupt PNG");
            if (scan == STBI__SCAN_header) { s->img_n = pal_img_n; return 1; }
            if ((int)(ioff + c.length) < (int)ioff) return 0;
            if (ioff + c.length > idata_limit) {
               stbi__uint32 idata_limit_old = idata_limit;
               stbi_uc *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               STBI_NOTUSED(idata_limit_old);
               p = (stbi_uc *) STBI_REALLOC_SIZED(z->idata, idata_limit_old, idata_limit); if (p == NULL) return stbi__err("outofmem", "Out of memory");
               z->idata = p;
            }
            if (!stbi__getn(s, z->idata+ioff,c.length)) return stbi__err("outofdata","Corrupt PNG");
            ioff += c.length;
            break;
         }

         case STBI__PNG_TYPE('I','E','N','D'): {
            stbi__uint32 raw_len, bpl;
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if (scan != STBI__SCAN_load) return 1;
            if (z->idata == NULL) return stbi__err("no IDAT","Corrupt PNG");
            // initial guess for decoded data size to avoid unnecessary reallocs
            bpl = (s->img_x * z->depth + 7) / 8; // bytes per line, per component
            raw_len = bpl * s->img_y * s->img_n /* pixels */ + s->img_y /* filter mode per row */;
            z->expanded = (stbi_uc *) stbi_zlib_decode_malloc_guesssize_headerflag((char *) z->idata, ioff, raw_len, (int *) &raw_len, !is_iphone);
            if (z->expanded == NULL) return 0; // zlib should set error
            STBI_FREE(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!stbi__create_png_image(z, z->expanded, raw_len, s->img_out_n, z->depth, color, interlace)) return 0;
            if (has_trans) {
               if (z->depth == 16) {
                  if (!stbi__compute_transparency16(z, tc16, s->img_out_n)) return 0;
               } else {
                  if (!stbi__compute_transparency(z, tc, s->img_out_n)) return 0;
               }
            }
            if (is_iphone && stbi__de_iphone_flag && s->img_out_n > 2)
               stbi__de_iphone(z);
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!stbi__expand_png_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            } else if (has_trans) {
               // non-paletted image with tRNS -> source image has (constant) alpha
               ++s->img_n;
            }
            STBI_FREE(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if (first) return stbi__err("first not IHDR", "Corrupt PNG");
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX PNG chunk not known";
               invalid_chunk[0] = STBI__BYTECAST(c.type >> 24);
               invalid_chunk[1] = STBI__BYTECAST(c.type >> 16);
               invalid_chunk[2] = STBI__BYTECAST(c.type >>  8);
               invalid_chunk[3] = STBI__BYTECAST(c.type >>  0);
               #endif
               return stbi__err(invalid_chunk, "PNG not supported: unknown PNG chunk type");
            }
            stbi__skip(s, c.length);
            break;
      }
      // end of PNG chunk, read and skip CRC
      stbi__get32be(s);
   }
}